

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCl.c
# Opt level: O0

uint32_t Hacl_Box_ZeroPad_crypto_box_detached
                   (uint8_t *c,uint8_t *mac,uint8_t *m,uint64_t mlen,uint8_t *n1,uint8_t *pk,
                   uint8_t *sk)

{
  uint32_t uVar1;
  uint32_t z;
  uint8_t *hsalsa_n;
  uint8_t *subkey;
  uint8_t *k1;
  uint8_t key [80];
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint8_t *mypublic;
  uint8_t *in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  uint64_t in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  uint8_t *in_stack_ffffffffffffffa0;
  uint8_t auStack_48 [72];
  
  memset(&stack0xffffffffffffff78,0,0x50);
  mypublic = auStack_48;
  Hacl_Curve25519_crypto_scalarmult
            (mypublic,(uint8_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (uint8_t *)0x11af8a);
  Hacl_Salsa20_hsalsa20
            (mypublic,(uint8_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (uint8_t *)0x11af9e);
  uVar1 = Hacl_SecretBox_ZeroPad_crypto_secretbox_detached
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return uVar1;
}

Assistant:

static uint32_t
Hacl_Box_ZeroPad_crypto_box_detached(
  uint8_t *c,
  uint8_t *mac,
  uint8_t *m,
  uint64_t mlen,
  uint8_t *n1,
  uint8_t *pk,
  uint8_t *sk
)
{
  uint8_t key[80U] = { 0U };
  uint8_t *k1 = key;
  uint8_t *subkey = key + (uint32_t)32U;
  uint8_t *hsalsa_n = key + (uint32_t)64U;
  Hacl_Curve25519_crypto_scalarmult(k1, sk, pk);
  Hacl_Salsa20_hsalsa20(subkey, k1, hsalsa_n);
  uint32_t z = Hacl_SecretBox_ZeroPad_crypto_secretbox_detached(c, mac, m, mlen, n1, subkey);
  return z;
}